

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkState.cpp
# Opt level: O3

void __thiscall xmrig::NetworkState::onActive(NetworkState *this,IClient *client)

{
  undefined8 uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar3;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  
  iVar2 = (*client->_vptr_IClient[10])(client);
  uVar1 = *(undefined8 *)(CONCAT44(extraout_var,iVar2) + 0x90);
  iVar2 = (*client->_vptr_IClient[10])(client);
  snprintf(this->pool,0xff,"%s:%d",uVar1,(ulong)*(ushort *)(CONCAT44(extraout_var_00,iVar2) + 0xb0))
  ;
  iVar2 = (*client->_vptr_IClient[0xb])(client);
  String::copy(&this->m_ip,(EVP_PKEY_CTX *)CONCAT44(extraout_var_01,iVar2),src);
  iVar2 = (*client->_vptr_IClient[8])(client);
  String::copy(&this->m_tls,(EVP_PKEY_CTX *)CONCAT44(extraout_var_02,iVar2),src_00);
  iVar2 = (*client->_vptr_IClient[7])(client);
  String::copy(&this->m_fingerprint,(EVP_PKEY_CTX *)CONCAT44(extraout_var_03,iVar2),src_01);
  this->m_active = true;
  lVar3 = std::chrono::_V2::steady_clock::now();
  this->m_connectionTime = lVar3 / 1000000;
  return;
}

Assistant:

void xmrig::NetworkState::onActive(IClient *client)
{
    snprintf(pool, sizeof(pool) - 1, "%s:%d", client->pool().host().data(), client->pool().port());

    m_ip             = client->ip();
    m_tls            = client->tlsVersion();
    m_fingerprint    = client->tlsFingerprint();
    m_active         = true;
    m_connectionTime = Chrono::steadyMSecs();
}